

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O3

void __thiscall TPZInterpolationSpace::ShortPrint(TPZInterpolationSpace *this,ostream *out)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"virtual void TPZInterpolationSpace::ShortPrint(std::ostream &) const",0x44);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"PreferredSideOrder ",0x13);
  plVar1 = (long *)std::ostream::operator<<(out,this->fPreferredOrder);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void TPZInterpolationSpace::ShortPrint(std::ostream &out) const {
    out << __PRETTY_FUNCTION__ << std::endl;
    out << "PreferredSideOrder " << fPreferredOrder << std::endl;
}